

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_load.c
# Opt level: O0

int cfgSet(void *ptr,mpt_path *p,mpt_value *val,int last,int curr)

{
  mpt_config *cfg;
  loadCtx *ctx;
  int curr_local;
  int last_local;
  mpt_value *val_local;
  mpt_path *p_local;
  void *ptr_local;
  
  if ((curr & 3U) == 3) {
    ptr_local._4_4_ = (**(code **)(**ptr + 8))(*ptr,p,val);
    if (ptr_local._4_4_ < 0) {
      if (*(long *)((long)ptr + 8) != 0) {
        mpt_log(*(mpt_logger **)((long)ptr + 8),*(char **)((long)ptr + 0x10),3,"%s",
                "failed to set global config element");
      }
    }
    else {
      ptr_local._4_4_ = 0;
    }
  }
  else {
    ptr_local._4_4_ = 0;
  }
  return ptr_local._4_4_;
}

Assistant:

static int cfgSet(void *ptr, const MPT_STRUCT(path) *p, const MPT_STRUCT(value) *val, int last, int curr)
{
	struct loadCtx *ctx = ptr;
	MPT_INTERFACE(config) *cfg;
	
	if ((curr & 0x3) != MPT_PARSEFLAG(Option)) {
		return 0;
	}
	cfg = ctx->cfg;
	if ((last = cfg->_vptr->assign(cfg, p, val)) < 0) {
		if (ctx->log) {
			mpt_log(ctx->log, ctx->fcn, MPT_LOG(Error), "%s",
			        MPT_tr("failed to set global config element"));
		}
		return last;
	}
	return 0;
}